

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestXmmXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86XmmReg_x86XmmReg *fun)

{
  x86XmmReg reg1;
  x86XmmReg reg2;
  int iVar1;
  long lVar2;
  long lVar3;
  uchar *puVar4;
  int local_48;
  
  puVar4 = stream;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    reg1 = testXmmRegs[lVar2];
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      reg2 = *(x86XmmReg *)((long)testXmmRegs + lVar3);
      EMIT_OP_REG_REG(ctx,op,reg1,reg2);
      iVar1 = (*fun)(puVar4,reg1,reg2);
      puVar4 = puVar4 + iVar1;
    }
  }
  local_48 = (int)stream;
  return (int)puVar4 - local_48;
}

Assistant:

int TestXmmXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86XmmReg src))
{
	unsigned char *start = stream;

	for(unsigned xmm1 = 0; xmm1 < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm1++)
	{
		for(unsigned xmm2 = 0; xmm2 < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm2++)
		{
			EMIT_OP_REG_REG(ctx, op, testXmmRegs[xmm1], testXmmRegs[xmm2]);
			stream += fun(stream, testXmmRegs[xmm1], testXmmRegs[xmm2]);
		}
	}

	return int(stream - start);
}